

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O3

CFGNode * __thiscall
dxil_spv::CFGStructurizer::get_or_create_ladder_block
          (CFGStructurizer *this,CFGNode *node,size_t header_index)

{
  CFGNode *header;
  CFGNode *pCVar1;
  CFGNode *pCVar2;
  
  header = (node->headers).
           super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
           ._M_impl.super__Vector_impl_data._M_start[header_index];
  pCVar1 = header->loop_ladder_block;
  if (header->loop_ladder_block == (CFGNode *)0x0) {
    pCVar2 = create_ladder_block(this,header,node,".merge");
    header->loop_ladder_block = pCVar2;
    pCVar1 = (CFGNode *)0x0;
    if (1 < header_index) {
      pCVar1 = pCVar2;
    }
  }
  return pCVar1;
}

Assistant:

CFGNode *CFGStructurizer::get_or_create_ladder_block(CFGNode *node, size_t header_index)
{
	auto *header = node->headers[header_index];
	auto *loop_ladder = header->loop_ladder_block;

	if (!loop_ladder)
	{
		// We don't have a ladder, because the loop merged to an outer scope, so we need to fake a ladder.
		// If we hit this case, we did not hit the simpler case in find_loops().
		auto *ladder = create_ladder_block(header, node, ".merge");
		header->loop_ladder_block = ladder;

		// If this is the second outermost scope, we don't need to deal with ladders.
		// ladder is a dummy branch straight out to the outer merge point.
		if (header_index > 1)
			loop_ladder = header->loop_ladder_block;
	}

	return loop_ladder;
}